

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O2

bool __thiscall
cmInstallCommand::MakeFilesFullPath
          (cmInstallCommand *this,char *modeName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *relFiles,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *absFiles)

{
  pointer pbVar1;
  bool bVar2;
  size_type sVar3;
  ostream *poVar4;
  pointer pbVar5;
  string file;
  ostringstream e;
  string local_1e8;
  string local_1c8;
  ostream local_1a8;
  
  pbVar5 = (relFiles->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  do {
    pbVar1 = (relFiles->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar5 == pbVar1) {
LAB_003c7461:
      return pbVar5 == pbVar1;
    }
    std::__cxx11::string::string((string *)&local_1c8,(string *)pbVar5);
    sVar3 = cmGeneratorExpression::Find(&local_1c8);
    if (sVar3 != 0) {
      bVar2 = cmsys::SystemTools::FileIsFullPath(local_1c8._M_dataplus._M_p);
      if (!bVar2) {
        cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
        std::__cxx11::string::assign((char *)&local_1c8);
        std::__cxx11::string::append((char *)&local_1c8);
        std::__cxx11::string::append((string *)&local_1c8);
      }
      if (sVar3 == 0xffffffffffffffff) {
        bVar2 = cmsys::SystemTools::FileIsDirectory(&local_1c8);
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          poVar4 = std::operator<<(&local_1a8,modeName);
          poVar4 = std::operator<<(poVar4," given directory \"");
          poVar4 = std::operator<<(poVar4,(string *)pbVar5);
          std::operator<<(poVar4,"\" to install.");
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&local_1e8);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          std::__cxx11::string::~string((string *)&local_1c8);
          goto LAB_003c7461;
        }
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(absFiles,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    pbVar5 = pbVar5 + 1;
  } while( true );
}

Assistant:

bool cmInstallCommand::MakeFilesFullPath(const char* modeName,
                                      const std::vector<std::string>& relFiles,
                                      std::vector<std::string>& absFiles)
{
  for(std::vector<std::string>::const_iterator fileIt = relFiles.begin();
      fileIt != relFiles.end();
      ++fileIt)
    {
    std::string file = (*fileIt);
    std::string::size_type gpos = cmGeneratorExpression::Find(file);
    if(gpos != 0 && !cmSystemTools::FileIsFullPath(file.c_str()))
      {
      file = this->Makefile->GetCurrentSourceDirectory();
      file += "/";
      file += *fileIt;
      }

    // Make sure the file is not a directory.
    if(gpos == file.npos && cmSystemTools::FileIsDirectory(file))
      {
      std::ostringstream e;
      e << modeName << " given directory \"" << (*fileIt) << "\" to install.";
      this->SetError(e.str());
      return false;
      }
    // Store the file for installation.
    absFiles.push_back(file);
    }
  return true;
}